

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_std.h
# Opt level: O1

double __thiscall
mp::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (mp *this,QuadraticObjective *obj,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  long lVar1;
  longdouble in_ST0;
  double dVar2;
  double dVar3;
  
  lVar1 = *(long *)(this + 0x18);
  dVar2 = 0.0;
  if (lVar1 != 0) {
    x = *(VarInfoImpl<std::vector<double,_std::allocator<double>_>_> **)(this + 0x50);
    dVar2 = 0.0;
    do {
      dVar2 = *(double *)(*(long *)(this + 8) + -8 + lVar1 * 8) *
              *(double *)
               (*(size_ty *)
                 ((long)&(obj->super_NLObjective).super_LinearObjective.lt_.coefs_.
                         super_small_vector_base<std::allocator<double>,_6U>.m_data.
                         super_small_vector_data_base<double_*,_unsigned_long> + 8) +
               (long)*(int *)((long)x + lVar1 * 4 + -4) * 8) + dVar2;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  QuadTerms::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
            ((longdouble *)(this + 0xa8),(QuadTerms *)obj,x);
  dVar3 = 0.0;
  if (-1 < (long)*(int *)(this + 0xa0)) {
    dVar3 = *(double *)
             (*(size_ty *)
               ((long)&(obj->super_NLObjective).super_LinearObjective.lt_.coefs_.
                       super_small_vector_base<std::allocator<double>,_6U>.m_data.
                       super_small_vector_data_base<double_*,_unsigned_long> + 8) +
             (long)*(int *)(this + 0xa0) * 8);
  }
  return dVar2 + (double)in_ST0 + dVar3;
}

Assistant:

double ComputeValue(
    const QuadraticObjective& obj, const VarVec& x) {
  double linp = obj.GetLinTerms().ComputeValue(x);
  double qp = obj.GetQPTerms().ComputeValue(x);
  double nlp = (obj.HasExpr() ? x[obj.ExprIndex()] : 0.0);
  return linp + qp + nlp;
}